

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void decode_bitfield(uint32_t data,bitfield_desc *bfdesc)

{
  bool bVar1;
  char *pcVar2;
  uint32_t uVar3;
  char *pcVar4;
  
  if (data == 0) {
    fputs("NONE",_stdout);
  }
  else {
    pcVar4 = ", ";
    bVar1 = false;
    uVar3 = data;
    do {
      if (bfdesc->name == (char *)0x0) {
        if (!bVar1) {
          pcVar4 = "";
        }
        fprintf(_stdout,"%sUNK%x",pcVar4,(ulong)uVar3);
        break;
      }
      if ((bfdesc->mask & uVar3) != 0) {
        pcVar2 = ", ";
        if (!bVar1) {
          pcVar2 = "";
        }
        fprintf(_stdout,"%s%s",pcVar2);
        uVar3 = uVar3 & ~bfdesc->mask;
        bVar1 = true;
      }
      bfdesc = bfdesc + 1;
    } while (uVar3 != 0);
  }
  fprintf(_stdout," (0x%x)",(ulong)data);
  return;
}

Assistant:

void decode_bitfield(uint32_t data, struct bitfield_desc *bfdesc)
{
	uint32_t data_ = data;
	int printed = 0;

	if (!data)
		mmt_log_cont("%s", "NONE");

	while (data && bfdesc->name)
	{
		if (data & bfdesc->mask)
		{
			mmt_log_cont("%s%s", printed ? ", " : "", bfdesc->name);
			data &= ~bfdesc->mask;
			printed = 1;
		}
		bfdesc++;
	}

	if (data)
		mmt_log_cont("%sUNK%x", printed ? ", " : "", data);

	mmt_log_cont(" (0x%x)", data_);
}